

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall
GlobOpt::NeedBailOnImplicitCallForLiveValues(GlobOpt *this,BasicBlock *block,bool isForwardPass)

{
  ValueSet *pVVar1;
  code *pcVar2;
  undefined4 *puVar3;
  BVSparse<Memory::JitArenaAllocator> *pBVar4;
  undefined7 in_register_00000011;
  bool bVar5;
  
  if ((int)CONCAT71(in_register_00000011,isForwardPass) == 0) {
    pBVar4 = block->noImplicitCallUses;
    do {
      pBVar4 = (BVSparse<Memory::JitArenaAllocator> *)pBVar4->head;
      if (pBVar4 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0046e53a;
    } while (((Type *)&pBVar4->alloc)->word == 0);
    if (pBVar4 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      return true;
    }
LAB_0046e53a:
    pBVar4 = block->noImplicitCallNoMissingValuesUses;
    do {
      pBVar4 = (BVSparse<Memory::JitArenaAllocator> *)pBVar4->head;
      if (pBVar4 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0046e5aa;
    } while (((Type *)&pBVar4->alloc)->word == 0);
    if (pBVar4 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3463,"(block->noImplicitCallNoMissingValuesUses->IsEmpty())",
                         "block->noImplicitCallNoMissingValuesUses->IsEmpty()");
      if (!bVar5) goto LAB_0046e6f8;
      *puVar3 = 0;
    }
LAB_0046e5aa:
    pBVar4 = block->noImplicitCallNativeArrayUses;
    do {
      pBVar4 = (BVSparse<Memory::JitArenaAllocator> *)pBVar4->head;
      if (pBVar4 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0046e61a;
    } while (((Type *)&pBVar4->alloc)->word == 0);
    if (pBVar4 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3464,"(block->noImplicitCallNativeArrayUses->IsEmpty())",
                         "block->noImplicitCallNativeArrayUses->IsEmpty()");
      if (!bVar5) goto LAB_0046e6f8;
      *puVar3 = 0;
    }
LAB_0046e61a:
    pBVar4 = block->noImplicitCallJsArrayHeadSegmentSymUses;
    do {
      pBVar4 = (BVSparse<Memory::JitArenaAllocator> *)pBVar4->head;
      if (pBVar4 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0046e686;
    } while (((Type *)&pBVar4->alloc)->word == 0);
    if (pBVar4 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3465,"(block->noImplicitCallJsArrayHeadSegmentSymUses->IsEmpty())",
                         "block->noImplicitCallJsArrayHeadSegmentSymUses->IsEmpty()");
      if (!bVar5) goto LAB_0046e6f8;
      *puVar3 = 0;
    }
LAB_0046e686:
    pBVar4 = block->noImplicitCallArrayLengthSymUses;
    do {
      pBVar4 = (BVSparse<Memory::JitArenaAllocator> *)pBVar4->head;
      if (pBVar4 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0046e6f1;
    } while (((Type *)&pBVar4->alloc)->word == 0);
    if (pBVar4 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3466,"(block->noImplicitCallArrayLengthSymUses->IsEmpty())",
                         "block->noImplicitCallArrayLengthSymUses->IsEmpty()");
      if (!bVar5) {
LAB_0046e6f8:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar3 = 0;
    }
LAB_0046e6f1:
    bVar5 = false;
  }
  else {
    pVVar1 = (block->globOptData).valuesToKillOnCalls;
    bVar5 = (pVVar1->
            super_BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ).count !=
            (pVVar1->
            super_BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ).freeCount;
  }
  return bVar5;
}

Assistant:

bool
GlobOpt::NeedBailOnImplicitCallForLiveValues(BasicBlock const * const block, const bool isForwardPass) const
{
    if(isForwardPass)
    {
        return block->globOptData.valuesToKillOnCalls->Count() != 0;
    }

    if(block->noImplicitCallUses->IsEmpty())
    {
        Assert(block->noImplicitCallNoMissingValuesUses->IsEmpty());
        Assert(block->noImplicitCallNativeArrayUses->IsEmpty());
        Assert(block->noImplicitCallJsArrayHeadSegmentSymUses->IsEmpty());
        Assert(block->noImplicitCallArrayLengthSymUses->IsEmpty());
        return false;
    }

    return true;
}